

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_smf_midiout.cpp
# Opt level: O3

DWORD * __thiscall
MIDISong2::MakeEvents(MIDISong2 *this,DWORD *events,DWORD *max_event_p,DWORD max_time)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  TrackInfo *pTVar5;
  TrackInfo *track;
  DWORD DVar6;
  DWORD delay;
  DWORD *events_00;
  long lVar7;
  bool sysex_noroom;
  bool local_41;
  DWORD local_40;
  uint local_3c;
  DWORD *local_38;
  
  track = this->TrackDue;
  if (events < max_event_p && track != (TrackInfo *)0x0) {
    local_3c = 0;
    local_40 = max_time;
    local_38 = events;
    do {
      DVar6 = track->Delay;
      delay = 0;
      do {
        iVar2 = (this->super_MIDIStreamer).Tempo;
        uVar3 = (this->super_MIDIStreamer).Division;
        iVar4 = this->NumTracks;
        if (0 < (long)iVar4) {
          pTVar5 = this->Tracks;
          lVar7 = 0;
          do {
            if ((&pTVar5->Finished)[lVar7] == false) {
              piVar1 = (int *)((long)&pTVar5->Delay + lVar7);
              *piVar1 = *piVar1 - DVar6;
              piVar1 = (int *)((long)&pTVar5->PlayedTime + lVar7);
              *piVar1 = *piVar1 + DVar6;
            }
            lVar7 = lVar7 + 0x40;
          } while ((long)iVar4 * 0x40 != lVar7);
        }
        delay = delay + DVar6;
        local_3c = local_3c + (iVar2 * DVar6) / uVar3;
        events_00 = events;
        do {
          local_41 = false;
          events = SendCommand(this,events_00,track,delay,(long)max_event_p - (long)events_00 >> 2,
                               &local_41);
          if (local_41 == true) {
            return events_00;
          }
          track = FindNextDue(this);
          this->TrackDue = track;
          if (track == (TrackInfo *)0x0) {
            return events;
          }
          if (events != events_00) {
            delay = 0;
          }
          DVar6 = track->Delay;
        } while ((events < max_event_p) && (events_00 = events, DVar6 == 0));
      } while (events == local_38);
    } while (((events < max_event_p) && (track != (TrackInfo *)0x0)) && (local_3c <= local_40));
  }
  return events;
}

Assistant:

DWORD *MIDISong2::MakeEvents(DWORD *events, DWORD *max_event_p, DWORD max_time)
{
	DWORD *start_events;
	DWORD tot_time = 0;
	DWORD time = 0;
	DWORD delay;

	start_events = events;
	while (TrackDue && events < max_event_p && tot_time <= max_time)
	{
		// It's possible that this tick may be nothing but meta-events and
		// not generate any real events. Repeat this until we actually
		// get some output so we don't send an empty buffer to the MIDI
		// device.
		do
		{
			delay = TrackDue->Delay;
			time += delay;
			// Advance time for all tracks by the amount needed for the one up next.
			tot_time += delay * Tempo / Division;
			AdvanceTracks(delay);
			// Play all events for this tick.
			do
			{
				bool sysex_noroom = false;
				DWORD *new_events = SendCommand(events, TrackDue, time, max_event_p - events, sysex_noroom);
				if (sysex_noroom)
				{
					return events;
				}
				TrackDue = FindNextDue();
				if (new_events != events)
				{
					time = 0;
				}
				events = new_events;
			}
			while (TrackDue && TrackDue->Delay == 0 && events < max_event_p);
		}
		while (start_events == events && TrackDue);
		time = 0;
	}
	return events;
}